

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjedi_index_impl.h
# Opt level: O0

void __thiscall
json::QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
find_a_zero(QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
            *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *cost_matrix,unsigned_long *matrix_size,
           vector<double,_std::allocator<double>_> *row_cover,
           vector<double,_std::allocator<double>_> *col_cover,int *row,int *col)

{
  reference this_00;
  reference pvVar1;
  ulong local_48;
  unsigned_long c;
  unsigned_long r;
  int *row_local;
  vector<double,_std::allocator<double>_> *col_cover_local;
  vector<double,_std::allocator<double>_> *row_cover_local;
  unsigned_long *matrix_size_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *cost_matrix_local;
  QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
  *this_local;
  
  *row = -1;
  *col = -1;
  c = 0;
  do {
    if (*matrix_size <= c) {
      return;
    }
    for (local_48 = 0; local_48 < *matrix_size; local_48 = local_48 + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](cost_matrix,c);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_48);
      if ((*pvVar1 == 0.0) && (!NAN(*pvVar1))) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](row_cover,c);
        if ((*pvVar1 == 0.0) && (!NAN(*pvVar1))) {
          pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](col_cover,local_48);
          if ((*pvVar1 == 0.0) && (!NAN(*pvVar1))) {
            *row = (int)c;
            *col = (int)local_48;
            return;
          }
        }
      }
    }
    c = c + 1;
  } while( true );
}

Assistant:

void QuickJEDITreeIndex<cost_matrixModel, TreeIndex>::find_a_zero(
    std::vector<std::vector<double> >& cost_matrix,
    unsigned long& matrix_size,
    std::vector<double>& row_cover,
    std::vector<double>& col_cover,
    int& row, int& col)
{
  row = -1;
  col = -1;
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (cost_matrix[r][c] == 0 && row_cover[r] == 0 && col_cover[c] == 0)
      {
        row = r;
        col = c;
        return;
      }
    }
  }
}